

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operator.cpp
# Opt level: O1

bool slang::ast::OpInfo::isArithmetic(BinaryOperator op)

{
  return (bool)((byte)(0x800001f >> ((byte)op & 0x1f)) & op < (LogicalShiftRight|Mod));
}

Assistant:

bool OpInfo::isArithmetic(BinaryOperator op) {
    switch (op) {
        case BinaryOperator::Add:
        case BinaryOperator::Subtract:
        case BinaryOperator::Multiply:
        case BinaryOperator::Divide:
        case BinaryOperator::Mod:
        case BinaryOperator::Power:
            return true;
        default:
            return false;
    }
}